

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

TRef lj_crecord_loadiu64(jit_State *J,TRef tr,cTValue *o)

{
  TRef TVar1;
  GCcdata *pGVar2;
  
  pGVar2 = argv2cdata(J,tr,o);
  if ((ushort)(pGVar2->ctypeid - 0xb) < 2) {
    (J->fold).ins.field_0.ot = (pGVar2->ctypeid != 0xb) + 0x4515;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = 0x19;
    TVar1 = lj_opt_fold(J);
    return TVar1;
  }
  lj_trace_err(J,LJ_TRERR_BADTYPE);
}

Assistant:

TRef lj_crecord_loadiu64(jit_State *J, TRef tr, cTValue *o)
{
  CTypeID id = argv2cdata(J, tr, o)->ctypeid;
  if (!(id == CTID_INT64 || id == CTID_UINT64))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  lj_needsplit(J);
  return emitir(IRT(IR_FLOAD, id == CTID_INT64 ? IRT_I64 : IRT_U64), tr,
		IRFL_CDATA_INT64);
}